

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 VmEvalChunk(jx9_vm *pVm,jx9_context *pCtx,SyString *pChunk,int iFlags,int bTrueReturn)

{
  SySet *pSVar1;
  jx9_value *pObj;
  GenBlock *pGVar2;
  sxi32 sVar3;
  uint uVar4;
  GenBlock *pGVar5;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  GenBlock *pBlock;
  ProcConsumer p_Var7;
  void *pvVar8;
  SySet aByteCode;
  SySet local_a0;
  anon_union_8_3_18420de5_for_x local_78;
  ulong uStack_70;
  jx9_vm *local_68;
  jx9_vm *pjStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_a0.nSize = 0;
  local_a0.eSize = 0x18;
  local_a0.nUsed = 0;
  local_a0.nCursor = 0;
  local_a0.pBase = (void *)0x0;
  local_a0.pUserData = (void *)0x0;
  local_a0.pAllocator = &pVm->sAllocator;
  local_a0.pBase = SyMemBackendAlloc(&pVm->sAllocator,0x300);
  if (local_a0.pBase != (void *)0x0) {
    local_a0.nSize = 0x20;
  }
  if (iFlags == 0) {
    p_Var7 = (ProcConsumer)0x0;
    pvVar8 = (void *)0x0;
  }
  else {
    p_Var7 = (pVm->pEngine->xConf).xErr;
    pvVar8 = (pVm->pEngine->xConf).pErrData;
  }
  pBlock = (pVm->sCodeGen).pCurrent;
  pGVar2 = pBlock->pParent;
  uVar6 = extraout_RDX;
  while (pGVar5 = pGVar2, pGVar5 != (GenBlock *)0x0) {
    GenStateFreeBlock(pBlock);
    uVar6 = extraout_RDX_00;
    pBlock = pGVar5;
    pGVar2 = pGVar5->pParent;
  }
  (pVm->sCodeGen).xErr = p_Var7;
  (pVm->sCodeGen).pErrData = pvVar8;
  (pVm->sCodeGen).pCurrent = &(pVm->sCodeGen).sGlobal;
  (pVm->sCodeGen).pIn = (SyToken *)0x0;
  (pVm->sCodeGen).pEnd = (SyToken *)0x0;
  (pVm->sCodeGen).nErr = 0;
  pSVar1 = pVm->pByteContainer;
  pVm->pByteContainer = &local_a0;
  jx9CompileScript(pVm,pChunk,(sxi32)uVar6);
  if ((pVm->sCodeGen).nErr == 0) {
    sVar3 = jx9VmEmitInstr(pVm,1,0,0,(void *)0x0,(sxu32 *)0x0);
    if (sVar3 == 0) {
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_48 = 0;
      if (iFlags == 0) {
        uVar4 = 0x20;
      }
      else {
        uVar4 = 8;
      }
      local_78.iVal._1_7_ = 0;
      local_78.iVal._0_1_ = iFlags != 0;
      uStack_70 = (ulong)uVar4;
      local_68 = pVm;
      pjStack_60 = pVm;
      VmLocalExec(pVm,&local_a0,(jx9_value *)&local_78);
      if (pCtx != (jx9_context *)0x0) {
        jx9MemObjStore((jx9_value *)&local_78,pCtx->pRet);
      }
      uVar4 = jx9MemObjRelease((jx9_value *)&local_78);
      pCtx = (jx9_context *)(ulong)uVar4;
      goto LAB_00124797;
    }
  }
  if (pCtx != (jx9_context *)0x0) {
    pObj = pCtx->pRet;
    jx9MemObjRelease(pObj);
    (pObj->x).rVal = 0.0;
    uVar4 = pObj->iFlags & 0xfffffe90U | 8;
    pCtx = (jx9_context *)(ulong)uVar4;
    pObj->iFlags = uVar4;
  }
LAB_00124797:
  sVar3 = (sxi32)pCtx;
  pVm->pByteContainer = pSVar1;
  if (((jx9_vm *)local_a0.pAllocator != (jx9_vm *)0x0) && (local_a0.pBase != (void *)0x0)) {
    sVar3 = SyMemBackendFree(local_a0.pAllocator,local_a0.pBase);
  }
  return sVar3;
}

Assistant:

static sxi32 VmEvalChunk(
	jx9_vm *pVm,        /* Underlying Virtual Machine */
	jx9_context *pCtx,  /* Call Context */
	SyString *pChunk,   /* JX9 chunk to evaluate */ 
	int iFlags,         /* Compile flag */
	int bTrueReturn     /* TRUE to return execution result */
	)
{
	SySet *pByteCode, aByteCode;
	ProcConsumer xErr = 0;
	void *pErrData = 0;
	/* Initialize bytecode container */
	SySetInit(&aByteCode, &pVm->sAllocator, sizeof(VmInstr));
	SySetAlloc(&aByteCode, 0x20);
	/* Reset the code generator */
	if( bTrueReturn ){
		/* Included file, log compile-time errors */
		xErr = pVm->pEngine->xConf.xErr;
		pErrData = pVm->pEngine->xConf.pErrData;
	}
	jx9ResetCodeGenerator(pVm, xErr, pErrData);
	/* Swap bytecode container */
	pByteCode = pVm->pByteContainer;
	pVm->pByteContainer = &aByteCode;
	/* Compile the chunk */
	jx9CompileScript(pVm, pChunk, iFlags);
	if( pVm->sCodeGen.nErr > 0 ){
		/* Compilation error, return false */
		if( pCtx ){
			jx9_result_bool(pCtx, 0);
		}
	}else{
		jx9_value sResult; /* Return value */
		if( SXRET_OK != jx9VmEmitInstr(pVm, JX9_OP_DONE, 0, 0, 0, 0) ){
			/* Out of memory */
			if( pCtx ){
				jx9_result_bool(pCtx, 0);
			}
			goto Cleanup;
		}
		if( bTrueReturn ){
			/* Assume a boolean true return value */
			jx9MemObjInitFromBool(pVm, &sResult, 1);
		}else{
			/* Assume a null return value */
			jx9MemObjInit(pVm, &sResult);
		}
		/* Execute the compiled chunk */
		VmLocalExec(pVm, &aByteCode, &sResult);
		if( pCtx ){
			/* Set the execution result */
			jx9_result_value(pCtx, &sResult);
		}
		jx9MemObjRelease(&sResult);
	}
Cleanup:
	/* Cleanup the mess left behind */
	pVm->pByteContainer = pByteCode;
	SySetRelease(&aByteCode);
	return SXRET_OK;
}